

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void DebugNodeDockNodeFlags(ImGuiDockNodeFlags *p_flags,char *label,bool enabled)

{
  undefined7 in_register_00000011;
  ImVec2 local_20;
  
  ImGui::PushID(label);
  local_20.x = 0.0;
  local_20.y = 0.0;
  ImGui::PushStyleVar(0xb,&local_20);
  ImGui::Text("%s:",label);
  if ((int)CONCAT71(in_register_00000011,enabled) == 0) {
    ImGui::BeginDisabled(true);
  }
  ImGui::CheckboxFlags("NoSplit",p_flags,0x10);
  ImGui::CheckboxFlags("NoResize",p_flags,0x20);
  ImGui::CheckboxFlags("NoResizeX",p_flags,0x400000);
  ImGui::CheckboxFlags("NoResizeY",p_flags,0x800000);
  ImGui::CheckboxFlags("NoTabBar",p_flags,0x1000);
  ImGui::CheckboxFlags("HiddenTabBar",p_flags,0x2000);
  ImGui::CheckboxFlags("NoWindowMenuButton",p_flags,0x4000);
  ImGui::CheckboxFlags("NoCloseButton",p_flags,0x8000);
  ImGui::CheckboxFlags("NoDocking",p_flags,0x10000);
  ImGui::CheckboxFlags("NoDockingSplitMe",p_flags,0x20000);
  ImGui::CheckboxFlags("NoDockingSplitOther",p_flags,0x40000);
  ImGui::CheckboxFlags("NoDockingOverMe",p_flags,0x80000);
  ImGui::CheckboxFlags("NoDockingOverOther",p_flags,0x100000);
  ImGui::CheckboxFlags("NoDockingOverEmpty",p_flags,0x200000);
  if (!enabled) {
    ImGui::EndDisabled();
  }
  ImGui::PopStyleVar(1);
  ImGui::PopID();
  return;
}

Assistant:

static void DebugNodeDockNodeFlags(ImGuiDockNodeFlags* p_flags, const char* label, bool enabled)
{
    using namespace ImGui;
    PushID(label);
    PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(0.0f, 0.0f));
    Text("%s:", label);
    if (!enabled)
        BeginDisabled();
    CheckboxFlags("NoSplit", p_flags, ImGuiDockNodeFlags_NoSplit);
    CheckboxFlags("NoResize", p_flags, ImGuiDockNodeFlags_NoResize);
    CheckboxFlags("NoResizeX", p_flags, ImGuiDockNodeFlags_NoResizeX);
    CheckboxFlags("NoResizeY",p_flags, ImGuiDockNodeFlags_NoResizeY);
    CheckboxFlags("NoTabBar", p_flags, ImGuiDockNodeFlags_NoTabBar);
    CheckboxFlags("HiddenTabBar", p_flags, ImGuiDockNodeFlags_HiddenTabBar);
    CheckboxFlags("NoWindowMenuButton", p_flags, ImGuiDockNodeFlags_NoWindowMenuButton);
    CheckboxFlags("NoCloseButton", p_flags, ImGuiDockNodeFlags_NoCloseButton);
    CheckboxFlags("NoDocking", p_flags, ImGuiDockNodeFlags_NoDocking);
    CheckboxFlags("NoDockingSplitMe", p_flags, ImGuiDockNodeFlags_NoDockingSplitMe);
    CheckboxFlags("NoDockingSplitOther", p_flags, ImGuiDockNodeFlags_NoDockingSplitOther);
    CheckboxFlags("NoDockingOverMe", p_flags, ImGuiDockNodeFlags_NoDockingOverMe);
    CheckboxFlags("NoDockingOverOther", p_flags, ImGuiDockNodeFlags_NoDockingOverOther);
    CheckboxFlags("NoDockingOverEmpty", p_flags, ImGuiDockNodeFlags_NoDockingOverEmpty);
    if (!enabled)
        EndDisabled();
    PopStyleVar();
    PopID();
}